

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InvertDatabase.h
# Opt level: O0

int __thiscall InvertDatabase::in_mem(InvertDatabase *this,int it)

{
  bool bVar1;
  reference pvVar2;
  __shared_ptr_access<Itemset,_(__gnu_cxx::_Lock_policy)2,_false,_false> *this_00;
  element_type *this_01;
  __shared_ptr_access<Array,_(__gnu_cxx::_Lock_policy)2,_false,_false> *this_02;
  Array local_30;
  InvertDatabase *pIStack_18;
  int it_local;
  InvertDatabase *this_local;
  
  local_30.totSize = it;
  pIStack_18 = this;
  pvVar2 = std::vector<int,_std::allocator<int>_>::operator[](&this->fidx,(long)it);
  this_00 = (__shared_ptr_access<Itemset,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
            std::vector<std::shared_ptr<Itemset>,_std::allocator<std::shared_ptr<Itemset>_>_>::
            operator[](&this->_items,(long)*pvVar2);
  this_01 = std::__shared_ptr_access<Itemset,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                      (this_00);
  this_02 = (__shared_ptr_access<Array,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
            Itemset::ival(this_01);
  std::__shared_ptr_access<Array,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->(this_02);
  Array::array(&local_30);
  bVar1 = std::operator==(&local_30.theArray,(nullptr_t)0x0);
  std::shared_ptr<std::vector<int,_std::allocator<int>_>_>::~shared_ptr(&local_30.theArray);
  this_local._4_4_ = (uint)!bVar1;
  return this_local._4_4_;
}

Assistant:

int in_mem(int it) {
        if (_items[fidx[it]]->ival()->array() == nullptr) return 0;
        else return 1;
    }